

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTDElementDecl.cpp
# Opt level: O3

CharDataOpts __thiscall xercesc_4_0::DTDElementDecl::getCharDataOpts(DTDElementDecl *this)

{
  int iVar1;
  CharDataOpts CVar2;
  
  iVar1 = *(int *)&(this->super_XMLElementDecl).field_0x2c;
  CVar2 = SpacesOk;
  if (iVar1 != 3) {
    CVar2 = (uint)(iVar1 != 0) * 2;
  }
  return CVar2;
}

Assistant:

XMLElementDecl::CharDataOpts DTDElementDecl::getCharDataOpts() const
{
    XMLElementDecl::CharDataOpts retVal;
    switch(fModelType)
    {
        case Children :
            retVal = XMLElementDecl::SpacesOk;
            break;

        case Empty :
            retVal = XMLElementDecl::NoCharData;
            break;

        default :
            retVal = XMLElementDecl::AllCharData;
            break;
    }
    return retVal;
}